

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O0

Qiniu_Error
Qiniu_CDN_GetLogList
          (Qiniu_Client *self,Qiniu_CDN_LogListRet *ret,char **domains,int domainsCount,char *day)

{
  char *pcVar1;
  Qiniu_CDN_LogListRet *self_00;
  cJSON *pcVar2;
  cJSON *item;
  Qiniu_Json *__s;
  size_t bodyLen;
  Qiniu_Error QVar3;
  undefined4 uStack_8c;
  undefined4 uStack_7c;
  Qiniu_Json *local_70;
  Qiniu_Json *jsonRet;
  char *body;
  Qiniu_Json *root;
  char *domainsStr;
  char *url;
  char *path;
  char *day_local;
  char **ppcStack_30;
  int domainsCount_local;
  char **domains_local;
  Qiniu_CDN_LogListRet *ret_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  url = "/v2/tune/log/list";
  path = day;
  day_local._4_4_ = domainsCount;
  ppcStack_30 = domains;
  domains_local = (char **)ret;
  ret_local = (Qiniu_CDN_LogListRet *)self;
  domainsStr = Qiniu_String_Concat2(QINIU_FUSION_HOST,"/v2/tune/log/list");
  root = (Qiniu_Json *)Qiniu_String_Join(";",ppcStack_30,day_local._4_4_);
  pcVar2 = cJSON_CreateObject();
  body = (char *)pcVar2;
  item = cJSON_CreateString(path);
  cJSON_AddItemToObject(pcVar2,"day",item);
  pcVar1 = body;
  pcVar2 = cJSON_CreateString((char *)root);
  cJSON_AddItemToObject((cJSON *)pcVar1,"domains",pcVar2);
  __s = (Qiniu_Json *)cJSON_PrintUnformatted((cJSON *)body);
  self_00 = ret_local;
  pcVar1 = domainsStr;
  local_70 = (Qiniu_Json *)0x0;
  jsonRet = __s;
  bodyLen = strlen((char *)__s);
  QVar3 = Qiniu_Client_CallWithBuffer2
                    ((Qiniu_Client *)self_00,&local_70,pcVar1,(char *)__s,bodyLen,"application/json"
                    );
  err._0_8_ = QVar3.message;
  self_local = (Qiniu_Client *)CONCAT44(uStack_7c,QVar3.code);
  if (QVar3.code == 200) {
    QVar3 = Qiniu_Parse_CDNLogListRet
                      (local_70,(Qiniu_CDN_LogListRet *)domains_local,ppcStack_30,day_local._4_4_);
    err._0_8_ = QVar3.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_8c,QVar3.code);
  }
  Qiniu_Free(domainsStr);
  Qiniu_Free(root);
  Qiniu_Free(jsonRet);
  cJSON_Delete((cJSON *)body);
  QVar3._0_8_ = (ulong)self_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

extern Qiniu_Error Qiniu_CDN_GetLogList(Qiniu_Client *self, Qiniu_CDN_LogListRet *ret,
                                        char *domains[], const int domainsCount, const char *day) {
    Qiniu_Error err;

    char *path = "/v2/tune/log/list";
    char *url = Qiniu_String_Concat2(QINIU_FUSION_HOST, path);

    char *domainsStr = Qiniu_String_Join(";", domains, domainsCount);

    Qiniu_Json *root = cJSON_CreateObject();
    cJSON_AddStringToObject(root, "day", day);
    cJSON_AddStringToObject(root, "domains", domainsStr);
    char *body = cJSON_PrintUnformatted(root);

    Qiniu_Json *jsonRet = NULL;

    err = Qiniu_Client_CallWithBuffer2(
            self, &jsonRet, url, body, strlen(body), "application/json");


    if (err.code == 200) {
        err = Qiniu_Parse_CDNLogListRet(jsonRet, ret, domains, domainsCount);
    }

    Qiniu_Free(url);
    Qiniu_Free(domainsStr);
    Qiniu_Free(body);
    cJSON_Delete(root);

    return err;
}